

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O3

Elem * __thiscall
Lib::
IterTraits<Lib::IterPointer<Lib::Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>_>
::next(Elem *__return_storage_ptr__,
      IterTraits<Lib::IterPointer<Lib::Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>_>
      *this)

{
  int iVar1;
  void **head;
  QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause> local_28;
  
  Indexing::SubstitutionTree<Indexing::LiteralClause>::
  Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
  ::next(&local_28,
         (Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
          *)(this->_iter)._p._self._M_t.
            super___uniq_ptr_impl<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_*,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
        );
  (__return_storage_ptr__->unifier)._obj = local_28.unifier._obj;
  (__return_storage_ptr__->unifier)._refCnt = local_28.unifier._refCnt;
  if (local_28.unifier._refCnt == (RefCounter *)0x0 ||
      local_28.unifier._obj == (ResultSubstitution *)0x0) {
    __return_storage_ptr__->data = local_28.data;
  }
  else {
    iVar1 = (local_28.unifier._refCnt)->_val;
    __return_storage_ptr__->data = local_28.data;
    (local_28.unifier._refCnt)->_val = iVar1;
    if (iVar1 == 0) {
      (*(local_28.unifier._obj)->_vptr_ResultSubstitution[1])();
      if (local_28.unifier._refCnt != (RefCounter *)0x0) {
        *(undefined8 *)local_28.unifier._refCnt = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_28.unifier._refCnt;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Elem next() 
  { return move_if_value<Elem>(_iter.next()); }